

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

ssize_t __thiscall pstack::CacheReader::read(CacheReader *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  Page *pPVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  void *__n;
  ulong uVar5;
  
  uVar4 = CONCAT44(in_register_00000034,__fd);
  uVar5 = uVar4;
  if ((void *)0xff < __buf) {
    peVar1 = (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar2 = (*peVar1->_vptr_Reader[2])(peVar1,uVar4,__buf,__nbytes);
    return CONCAT44(extraout_var,iVar2);
  }
  do {
    if (__buf == (void *)0x0) break;
    pPVar3 = getPage(this,uVar5 & 0xffffffffffffff00);
    __n = (void *)(pPVar3->len - (uVar5 & 0xff));
    if (__buf < __n) {
      __n = __buf;
    }
    memcpy((void *)__nbytes,(pPVar3->data)._M_elems + (uVar5 & 0xff),(size_t)__n);
    uVar5 = uVar5 + (long)__n;
    __buf = (void *)((long)__buf - (long)__n);
    __nbytes = __nbytes + (long)__n;
  } while (pPVar3->len == 0x100);
  return uVar5 - uVar4;
}

Assistant:

size_t
CacheReader::read(Off off, size_t count, char *ptr) const
{
    if (count >= PAGESIZE)
        return upstream->read(off, count, ptr);
    Off startoff = off;
    for (;;) {
        if (count == 0)
            break;
        size_t offsetOfDataInPage = off % PAGESIZE;
        Off offsetOfPageInFile = off - offsetOfDataInPage;
        try {
           Page &page = getPage(offsetOfPageInFile);
           size_t chunk = std::min(page.len - offsetOfDataInPage, count);
           memcpy(ptr, page.data.data() + offsetOfDataInPage, chunk);
           off += chunk;
           count -= chunk;
           ptr += chunk;
           if (page.len != PAGESIZE)
               break;
        }
        catch (const Exception &e) {
           break;
        }
    }
    return off - startoff;
}